

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool get_end_of_header(HttpProxyNegotiator *s)

{
  bool bVar1;
  _Bool local_21;
  ulong local_20;
  size_t pos;
  HttpProxyNegotiator *s_local;
  
  local_20 = s->header_pos;
  while( true ) {
    local_21 = false;
    if (local_20 < s->header->len) {
      local_21 = is_whitespace(s->header->s[local_20]);
    }
    if (local_21 == false) break;
    local_20 = local_20 + 1;
  }
  bVar1 = local_20 == s->header->len;
  if (bVar1) {
    s->header_pos = local_20;
  }
  return bVar1;
}

Assistant:

static bool get_end_of_header(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len) {
        s->header_pos = pos;
        return true;
    }

    return false;
}